

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,void *end)

{
  ZSTD_strategy ZVar1;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  BYTE *iend;
  
  ZVar1 = (ms->cParams).strategy;
  if (ZVar1 - ZSTD_greedy < 7) {
    return (ulong)ZVar1;
  }
  if (ZVar1 != ZSTD_dfast) {
    if (ZVar1 == ZSTD_fast) {
      ZSTD_fillHashTable(ms,end,ZSTD_dtlm_fast,ZSTD_tfp_forCCtx);
      return extraout_RAX;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x105,"size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *, const void *)");
  }
  ZSTD_fillDoubleHashTable(ms,end,ZSTD_dtlm_fast,ZSTD_tfp_forCCtx);
  return extraout_RAX_00;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(ms->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}